

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts_no_zeroinit.h
# Opt level: O0

void __thiscall BRTS_XZ<UF>::SecondScan(BRTS_XZ<UF> *this)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint *puVar6;
  int label;
  unsigned_short end_pos;
  unsigned_short start_pos;
  int j;
  uint *labels;
  Run *pRStack_20;
  int i;
  Run *runs;
  int h;
  int w;
  BRTS_XZ<UF> *this_local;
  
  iVar3 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  iVar4 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  pRStack_20 = (this->data_runs).runs;
  for (labels._4_4_ = 0; labels._4_4_ < iVar4; labels._4_4_ = labels._4_4_ + 1) {
    puVar6 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,labels._4_4_);
    label = 0;
    for (; uVar1 = pRStack_20->start_pos, uVar1 != 0xffff; pRStack_20 = pRStack_20 + 1) {
      uVar2 = pRStack_20->end_pos;
      uVar5 = UF::GetLabel(pRStack_20->label);
      for (; label < (int)(uint)uVar1; label = label + 1) {
        puVar6[label] = 0;
      }
      for (; label < (int)(uint)uVar2; label = label + 1) {
        puVar6[label] = uVar5;
      }
    }
    for (; label < iVar3; label = label + 1) {
      puVar6[label] = 0;
    }
    pRStack_20 = pRStack_20 + 1;
  }
  return;
}

Assistant:

void SecondScan() {
        int w(img_.cols);
        int h(img_.rows);

        Run* runs = data_runs.runs;
        for (int i = 0; i < h; i++) {
            unsigned* const labels = img_labels_.ptr<unsigned>(i);
            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (; j < w; j++) labels[j] = 0;
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (; j < start_pos; j++) labels[j] = 0;
                for (; j < end_pos; j++) labels[j] = label;
            }
        }
    }